

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O3

R2Rect * __thiscall R2Rect::Intersection(R2Rect *this,R2Rect *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  R2Rect *in_RDI;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  dVar1 = this->bounds_[0].bounds_.c_[0];
  dVar2 = this->bounds_[0].bounds_.c_[1];
  dVar3 = this->bounds_[1].bounds_.c_[0];
  dVar4 = this->bounds_[1].bounds_.c_[1];
  dVar5 = other->bounds_[0].bounds_.c_[0];
  dVar6 = other->bounds_[0].bounds_.c_[1];
  dVar7 = other->bounds_[1].bounds_.c_[0];
  dVar8 = other->bounds_[1].bounds_.c_[1];
  uVar9 = -(ulong)(dVar1 < dVar5);
  uVar10 = -(ulong)(dVar6 < dVar2);
  auVar16._0_8_ = (ulong)dVar5 & uVar9;
  auVar16._8_8_ = (ulong)dVar6 & uVar10;
  auVar11._0_8_ = ~uVar9 & (ulong)dVar1;
  auVar11._8_8_ = ~uVar10 & (ulong)dVar2;
  auVar11 = auVar11 | auVar16;
  uVar9 = -(ulong)(dVar3 < dVar7);
  uVar10 = -(ulong)(dVar8 < dVar4);
  auVar19._0_8_ = (ulong)dVar7 & uVar9;
  auVar19._8_8_ = (ulong)dVar8 & uVar10;
  auVar12._0_8_ = ~uVar9 & (ulong)dVar3;
  auVar12._8_8_ = ~uVar10 & (ulong)dVar4;
  auVar12 = auVar12 | auVar19;
  auVar13._0_8_ = auVar11._8_8_;
  auVar13._8_4_ = auVar11._8_4_;
  auVar13._12_4_ = auVar11._12_4_;
  auVar14._8_8_ = -(ulong)(auVar13._8_8_ < auVar13._0_8_);
  auVar14._0_8_ = -(ulong)(auVar13._0_8_ < auVar11._0_8_);
  auVar17._0_8_ = auVar12._8_8_;
  auVar17._8_4_ = auVar12._8_4_;
  auVar17._12_4_ = auVar12._12_4_;
  auVar18._8_8_ = -(ulong)(auVar17._8_8_ < auVar17._0_8_);
  auVar18._0_8_ = -(ulong)(auVar17._0_8_ < auVar12._0_8_);
  auVar18 = auVar18 | auVar14;
  auVar15._0_8_ = auVar18._0_8_;
  auVar15._8_4_ = auVar18._0_4_;
  auVar15._12_4_ = auVar18._4_4_;
  *(undefined1 (*) [16])in_RDI->bounds_[0].bounds_.c_ =
       ~auVar15 & auVar11 | ZEXT816(0x3ff0000000000000) & auVar18;
  *(undefined1 (*) [16])in_RDI->bounds_[1].bounds_.c_ =
       ~auVar15 & auVar12 | ZEXT816(0x3ff0000000000000) & auVar18;
  return in_RDI;
}

Assistant:

R2Rect R2Rect::Intersection(const R2Rect& other) const {
  R1Interval xx = x().Intersection(other.x());
  R1Interval yy = y().Intersection(other.y());
  if (xx.is_empty() || yy.is_empty()) return Empty();
  return R2Rect(xx, yy);
}